

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_ClassArray<ON_TextureCoordinates> * __thiscall
ON_ClassArray<ON_TextureCoordinates>::operator=
          (ON_ClassArray<ON_TextureCoordinates> *this,ON_ClassArray<ON_TextureCoordinates> *src)

{
  int iVar1;
  long lVar2;
  ON_SimpleArray<ON_3fPoint> *this_00;
  long lVar3;
  ON_SimpleArray<ON_3fPoint> *src_00;
  
  if (this != src) {
    iVar1 = src->m_count;
    if ((long)iVar1 < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < iVar1) {
        SetCapacity(this,(long)iVar1);
      }
      if ((this->m_a != (ON_TextureCoordinates *)0x0) &&
         (iVar1 = src->m_count, this->m_count = iVar1, 0 < iVar1)) {
        lVar3 = 0xa0;
        lVar2 = 0;
        do {
          src_00 = (ON_SimpleArray<ON_3fPoint> *)((src->m_a->m_tag).m_mapping_id.Data4 + lVar3 + -8)
          ;
          this_00 = (ON_SimpleArray<ON_3fPoint> *)
                    ((this->m_a->m_tag).m_mapping_id.Data4 + lVar3 + -8);
          memcpy(&this_00[-7].m_a,&src_00[-7].m_a,0x9c);
          ON_SimpleArray<ON_3fPoint>::operator=(this_00,src_00);
          lVar2 = lVar2 + 1;
          lVar3 = lVar3 + 0xb8;
        } while (lVar2 < this->m_count);
      }
    }
  }
  return this;
}

Assistant:

ON_ClassArray<T>& ON_ClassArray<T>::operator=( const ON_ClassArray<T>& src )
{
  int i;
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        for ( i = 0; i < m_count; i++ ) {
          m_a[i] = src.m_a[i];
        }
      }
    }
  }  
  return *this;
}